

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O2

void func_call_by_ptr_arr(size_t COUNT)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  size_t res;
  undefined8 local_38;
  double local_30;
  
  for (lVar3 = 0; lVar3 != 0x8000000; lVar3 = lVar3 + 8) {
    iVar1 = rand();
    *(int *)((long)&arr[0].value + lVar3) = iVar1;
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  local_38 = 0;
  for (lVar4 = 0; lVar4 != 0x8000000; lVar4 = lVar4 + 8) {
    (*(code *)(&PTR_f1_00108d30)[(int)local_38 + *(int *)((long)&arr[0].value + lVar4) & 7])
              (&local_38);
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  side_effect = side_effect + ((uint)local_38 & 1);
  dVar5 = (double)(lVar4 - lVar3) / 1000000000.0;
  dVar6 = dVar5 * 1000.0 * 1000.0 * 1000.0 * 5.9604644775390625e-08;
  local_30 = ((16777216.0 / dVar5) / 1000.0) / 1000.0;
  expand_name("func_call_by_ptr_arr");
  poVar2 = std::operator<<((ostream *)&std::cout,expand_name::buf);
  std::operator<<(poVar2,": ");
  poVar2 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar2,"ns per operation,\t");
  poVar2 = std::ostream::_M_insert<double>(dVar6 / unit);
  std::operator<<(poVar2," ticks,\t");
  poVar2 = std::ostream::_M_insert<double>(local_30);
  poVar2 = std::operator<<(poVar2," Mrps");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

static void __attribute__((noinline))
func_call_by_ptr_arr(const size_t COUNT = SIZE)
{
    f_t f[8] = {f1, f2, f3, f4, f5, f6, f7, f8};
    for (uint32_t i = 0; i < COUNT; i++)
    {
        arr[i].value = rand();
    }

    now_t start = now();
    size_t res = 0;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        f[(res + arr[i].value) % 8](res);
    }
    now_t stop = now();
    side_effect += res % 2;

    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}